

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystemImpl.cpp
# Opt level: O1

string * efsw::Platform::findDevicePath(string *__return_storage_ptr__,string *directory)

{
  int iVar1;
  long lVar2;
  undefined8 *puVar3;
  bool bVar4;
  string dirName;
  allocator local_51;
  undefined1 *local_50;
  size_t local_48;
  undefined1 local_40 [16];
  
  lVar2 = setmntent("/proc/mounts","r");
  if (lVar2 != 0) {
    puVar3 = (undefined8 *)getmntent(lVar2);
    if (puVar3 != (undefined8 *)0x0) {
      do {
        std::__cxx11::string::string((string *)&local_50,(char *)puVar3[1],&local_51);
        if (local_48 == directory->_M_string_length) {
          if (local_48 == 0) {
            bVar4 = true;
          }
          else {
            iVar1 = bcmp(local_50,(directory->_M_dataplus)._M_p,local_48);
            bVar4 = iVar1 == 0;
          }
        }
        else {
          bVar4 = false;
        }
        if (bVar4) {
          std::__cxx11::string::string((string *)__return_storage_ptr__,(char *)*puVar3,&local_51);
          endmntent(lVar2);
          if (local_50 != local_40) {
            operator_delete(local_50);
          }
          if (bVar4) {
            return __return_storage_ptr__;
          }
        }
        else if (local_50 != local_40) {
          operator_delete(local_50);
        }
        puVar3 = (undefined8 *)getmntent(lVar2);
      } while (puVar3 != (undefined8 *)0x0);
    }
    endmntent(lVar2);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  return __return_storage_ptr__;
}

Assistant:

std::string findDevicePath( const std::string& directory ) {
	struct mntent* ent;
	FILE* aFile;

	aFile = setmntent( "/proc/mounts", "r" );

	if ( aFile == NULL )
		return "";

	while ( NULL != ( ent = getmntent( aFile ) ) ) {
		std::string dirName( ent->mnt_dir );

		if ( dirName == directory ) {
			std::string fsName( ent->mnt_fsname );

			endmntent( aFile );

			return fsName;
		}
	}

	endmntent( aFile );

	return "";
}